

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iinq.c
# Opt level: O3

void run_all_tests_iinq(void)

{
  planck_unit_suite_t *suite;
  
  suite = iinq_get_suite();
  planck_unit_run_suite(suite);
  planck_unit_destroy_suite(suite);
  remove("ion_mt.tbl");
  remove("1.bpt");
  remove("1.val");
  remove("2.bpt");
  remove("2.val");
  remove("3.bpt");
  remove("3.val");
  remove("4.bpt");
  remove("4.val");
  remove("5.bpt");
  remove("5.val");
  return;
}

Assistant:

void
run_all_tests_iinq(
) {
	planck_unit_suite_t *suite = iinq_get_suite();

	planck_unit_run_suite(suite);

	planck_unit_destroy_suite(suite);

	fremove(ION_MASTER_TABLE_FILENAME);
	fremove("1.bpt");
	fremove("1.val");
	fremove("2.bpt");
	fremove("2.val");
	fremove("3.bpt");
	fremove("3.val");
	fremove("4.bpt");
	fremove("4.val");
	fremove("5.bpt");
	fremove("5.val");
}